

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O3

void __thiscall
CryptoUtil_ConvertSignatureFromDerHexEmpty_Test::TestBody
          (CryptoUtil_ConvertSignatureFromDerHexEmpty_Test *this)

{
  void *pvVar1;
  bool bVar2;
  char *in_R9;
  ByteData hex_sig;
  ByteData byte_data;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  AssertHelper local_30;
  ByteData local_28;
  
  cfd::core::ByteData::ByteData((ByteData *)&local_50);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_28,(ByteData *)&local_50,(SigHashType *)0x0)
  ;
  pvVar1 = (void *)CONCAT71(local_28.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_28.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_28.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_50._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_50._M_dataplus._M_p,
                    local_50.field_2._M_allocated_capacity - (long)local_50._M_dataplus._M_p);
  }
  local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = (internal)0x0;
  local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::Message::Message((Message *)&local_58);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_50,(internal *)&local_28,(AssertionResult *)0x532708,"false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
             ,0x22d,local_50._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_58.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_58.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureFromDerHexEmpty) {
  try {
    ByteData hex_sig;
    ByteData byte_data = CryptoUtil::ConvertSignatureFromDer(hex_sig, nullptr);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "der decode error.");
    return;
  }
  ASSERT_TRUE(false);
}